

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_page_element * nk_pool_alloc(nk_pool *pool)

{
  uint uVar1;
  nk_page *pnVar2;
  nk_size size;
  nk_page *page;
  nk_pool *pool_local;
  
  if ((pool->pages == (nk_page *)0x0) || (pool->capacity <= pool->pages->size)) {
    if (pool->type == NK_BUFFER_FIXED) {
      if (pool->pages == (nk_page *)0x0) {
        __assert_fail("pool->pages",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x3b99,"struct nk_page_element *nk_pool_alloc(struct nk_pool *)");
      }
      if (pool->pages == (nk_page *)0x0) {
        return (nk_page_element *)0x0;
      }
      if (pool->pages->size < pool->capacity) {
        return (nk_page_element *)0x0;
      }
      __assert_fail("pool->pages->size < pool->capacity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x3b9b,"struct nk_page_element *nk_pool_alloc(struct nk_pool *)");
    }
    pnVar2 = (nk_page *)(*(pool->alloc).alloc)((pool->alloc).userdata,(void *)0x0,0x2110);
    pnVar2->next = pool->pages;
    pool->pages = pnVar2;
    pnVar2->size = 0;
  }
  pnVar2 = pool->pages;
  uVar1 = pool->pages->size;
  pool->pages->size = uVar1 + 1;
  return pnVar2->win + uVar1;
}

Assistant:

NK_LIB struct nk_page_element*
nk_pool_alloc(struct nk_pool *pool)
{
    if (!pool->pages || pool->pages->size >= pool->capacity) {
        /* allocate new page */
        struct nk_page *page;
        if (pool->type == NK_BUFFER_FIXED) {
            NK_ASSERT(pool->pages);
            if (!pool->pages) return 0;
            NK_ASSERT(pool->pages->size < pool->capacity);
            return 0;
        } else {
            nk_size size = sizeof(struct nk_page);
            size += NK_POOL_DEFAULT_CAPACITY * sizeof(union nk_page_data);
            page = (struct nk_page*)pool->alloc.alloc(pool->alloc.userdata,0, size);
            page->next = pool->pages;
            pool->pages = page;
            page->size = 0;
        }
    } return &pool->pages->win[pool->pages->size++];
}